

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrUpdateBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  int iVar2;
  Mio_Library_t *pLib;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  Mio_Gate_t *pGate;
  Mio_Pin_t *pPin;
  char *pcVar6;
  ulong uVar7;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (0 < vBox->nSize) {
    pcVar5 = (char *)*vBox->pArray;
    iVar2 = strcmp(pcVar5,"Const0T");
    if (iVar2 == 0) {
      lVar3 = 8;
      if (vGatesNames->nSize < 2) goto LAB_003bb007;
    }
    else {
      iVar2 = strcmp(pcVar5,"Const1T");
      if (iVar2 == 0) {
        lVar3 = 0x10;
        if (vGatesNames->nSize < 3) goto LAB_003bb007;
      }
      else {
        iVar2 = strcmp(pcVar5,"BufT");
        if (iVar2 == 0) {
          lVar3 = 0x18;
          if (vGatesNames->nSize < 4) goto LAB_003bb007;
        }
        else {
          iVar2 = strcmp(pcVar5,"InvT");
          if (iVar2 == 0) {
            lVar3 = 0x20;
            if (vGatesNames->nSize < 5) goto LAB_003bb007;
          }
          else {
            iVar2 = strcmp(pcVar5,"AndT");
            if (iVar2 == 0) {
              lVar3 = 0x28;
              if (vGatesNames->nSize < 6) goto LAB_003bb007;
            }
            else {
              iVar2 = strcmp(pcVar5,"NandT");
              if (iVar2 == 0) {
                lVar3 = 0x30;
                if (vGatesNames->nSize < 7) goto LAB_003bb007;
              }
              else {
                iVar2 = strcmp(pcVar5,"OrT");
                if (iVar2 == 0) {
                  lVar3 = 0x38;
                  if (vGatesNames->nSize < 8) goto LAB_003bb007;
                }
                else {
                  iVar2 = strcmp(pcVar5,"NorT");
                  if (iVar2 == 0) {
                    lVar3 = 0x40;
                    if (vGatesNames->nSize < 9) goto LAB_003bb007;
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"XorT");
                    if (iVar2 == 0) {
                      lVar3 = 0x48;
                      if (vGatesNames->nSize < 10) goto LAB_003bb007;
                    }
                    else {
                      iVar2 = strcmp(pcVar5,"XnorT");
                      if (iVar2 != 0) {
                        return;
                      }
                      lVar3 = 0x50;
                      if (vGatesNames->nSize < 0xb) goto LAB_003bb007;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pcVar6 = *(char **)((long)vGatesNames->pArray + lVar3);
    if (pcVar5 != (char *)0x0) {
      free(pcVar5);
    }
    if (pcVar6 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar6);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,pcVar6);
    }
    iVar2 = vBox->nSize;
    if (0 < iVar2) {
      *vBox->pArray = pcVar5;
      if (iVar2 == 1) goto LAB_003bb007;
      if ((vBox->pArray[1] == (void *)0x0) || (free(vBox->pArray[1]), 1 < vBox->nSize)) {
        vBox->pArray[1] = (void *)0x0;
        pGate = Mio_LibraryReadGateByName(pLib,pcVar6,(char *)0x0);
        pPin = Mio_GateReadPins(pGate);
        if (pPin == (Mio_Pin_t *)0x0) {
          uVar7 = 2;
        }
        else {
          uVar7 = 2;
          do {
            if ((long)vBox->nSize <= (long)uVar7) goto LAB_003bb007;
            if (vBox->pArray[uVar7] != (void *)0x0) {
              free(vBox->pArray[uVar7]);
            }
            pcVar5 = Mio_PinReadName(pPin);
            if (pcVar5 == (char *)0x0) {
              pcVar6 = (char *)0x0;
            }
            else {
              sVar4 = strlen(pcVar5);
              pcVar6 = (char *)malloc(sVar4 + 1);
              strcpy(pcVar6,pcVar5);
            }
            if ((long)vBox->nSize <= (long)uVar7) goto LAB_003bb026;
            vBox->pArray[uVar7] = pcVar6;
            pPin = Mio_PinReadNext(pPin);
            uVar7 = uVar7 + 2;
          } while (pPin != (Mio_Pin_t *)0x0);
        }
        iVar2 = (int)uVar7;
        if (vBox->nSize <= iVar2) goto LAB_003bb007;
        pcVar5 = Mio_GateReadOutName(pGate);
        if (pcVar5 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          sVar4 = strlen(pcVar5);
          pcVar6 = (char *)malloc(sVar4 + 1);
          strcpy(pcVar6,pcVar5);
        }
        iVar1 = vBox->nSize;
        if (iVar2 < iVar1) {
          vBox->pArray[uVar7 & 0xffffffff] = pcVar6;
          if (iVar2 + 2 == iVar1) {
            return;
          }
          __assert_fail("2 * i == Vec_PtrSize(vBox)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtr.c"
                        ,0x171,"void Bac_PtrUpdateBox(Vec_Ptr_t *, Vec_Ptr_t *)");
        }
      }
    }
LAB_003bb026:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
LAB_003bb007:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrUpdateBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    Mio_Gate_t * pGate;  Mio_Pin_t * pPin; int i = 1;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    // update gate name
    char * pNameNew, * pName = (char *)Vec_PtrEntry(vBox, 0);
    if ( !strcmp(pName, "Const0T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C0);
    else if ( !strcmp(pName, "Const1T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C1);
    else if ( !strcmp(pName, "BufT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_BUF);
    else if ( !strcmp(pName, "InvT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_INV);
    else if ( !strcmp(pName, "AndT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_AND);
    else if ( !strcmp(pName, "NandT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NAND);
    else if ( !strcmp(pName, "OrT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_OR);
    else if ( !strcmp(pName, "NorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NOR);
    else if ( !strcmp(pName, "XorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XOR);
    else if ( !strcmp(pName, "XnorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XNOR);
    else // user hierarchy
        return;
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 0, Abc_UtilStrsav(pNameNew) );
    // remove instance name
    pName = (char *)Vec_PtrEntry(vBox, 1);
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 1, NULL );
    // update formal input names
    pGate = Mio_LibraryReadGateByName( pLib, pNameNew, NULL );
    Mio_GateForEachPin( pGate, pPin )
    {
        pName = (char *)Vec_PtrEntry( vBox, 2 * i );
        ABC_FREE( pName );
        pNameNew = Mio_PinReadName(pPin);
        Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    }
    // update output name
    pName = (char *)Vec_PtrEntry( vBox, 2 * i );
    pNameNew = Mio_GateReadOutName(pGate);
    Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    assert( 2 * i == Vec_PtrSize(vBox) );
}